

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.h
# Opt level: O0

void __thiscall SuffixTree::Node::Node(Node *this,Node *parent_,Node *suffix_link_)

{
  Node *suffix_link__local;
  Node *parent__local;
  Node *this_local;
  
  this->parent = parent_;
  this->suffix_link = suffix_link_;
  this->lca_class = this;
  this->dsu_parent = this;
  this->num_leaves = 0;
  this->num_lca = 0;
  std::
  unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
  ::unordered_map(&this->edges);
  return;
}

Assistant:

Node (Node *parent_, Node *suffix_link_) :
        parent (parent_),
        suffix_link (suffix_link_),
        lca_class (this),
        dsu_parent (this),
        num_leaves (0),
        num_lca (0)
    {}